

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_3965cd::SQLiteBuildDB::getKeys
          (SQLiteBuildDB *this,
          vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *keys_out,
          string *error_out)

{
  uint uVar1;
  int iVar2;
  int __oflag;
  KeyType local_90;
  char *local_70;
  char *text;
  undefined1 local_60 [4];
  int size;
  undefined8 local_40;
  sqlite3_stmt *stmt;
  int result;
  lock_guard<std::mutex> guard;
  string *error_out_local;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *keys_out_local;
  SQLiteBuildDB *this_local;
  
  guard._M_device = (mutex_type *)error_out;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&result,&this->dbMutex);
  uVar1 = open(this,(char *)guard._M_device,__oflag);
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    stmt._0_4_ = sqlite3_prepare_v2(this->db,"SELECT key FROM key_names;",0xffffffff,&local_40,0);
    if ((int)stmt == 0) {
      while (iVar2 = sqlite3_step(local_40), iVar2 == 100) {
        iVar2 = sqlite3_column_count(local_40);
        if (iVar2 != 1) {
          __assert_fail("sqlite3_column_count(stmt) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                        ,0x2d5,
                        "virtual bool (anonymous namespace)::SQLiteBuildDB::getKeys(std::vector<KeyType> &, std::string *)"
                       );
        }
        text._4_4_ = sqlite3_column_bytes(local_40,0);
        local_70 = (char *)sqlite3_column_text(local_40,0);
        llbuild::core::KeyType::KeyType(&local_90,local_70,(long)text._4_4_);
        std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::push_back
                  (keys_out,&local_90);
        llbuild::core::KeyType::~KeyType(&local_90);
      }
      sqlite3_finalize(local_40);
      this_local._7_1_ = true;
    }
    else {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                ((string *)local_60,this);
      std::__cxx11::string::operator=((string *)guard._M_device,(string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      this_local._7_1_ = false;
    }
  }
  stmt._4_4_ = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&result);
  return this_local._7_1_;
}

Assistant:

virtual bool getKeys(std::vector<KeyType>& keys_out, std::string* error_out) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    if (!open(error_out))
      return false;

    // Search for the key in the database
    int result;
    sqlite3_stmt* stmt;
    result = sqlite3_prepare_v2(db, "SELECT key FROM key_names;",
                                -1, &stmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    while (sqlite3_step(stmt) == SQLITE_ROW) {
      assert(sqlite3_column_count(stmt) == 1);

      auto size = sqlite3_column_bytes(stmt, 0);
      auto text = (const char*) sqlite3_column_text(stmt, 0);

      keys_out.push_back(KeyType(text, size));
    }

    sqlite3_finalize(stmt);

    return true;
  }